

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatclient.cpp
# Opt level: O2

void __thiscall ChatClient::jsonReceived(ChatClient *this,QJsonObject *docObj)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QLatin1String QVar4;
  QLatin1String QVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QLatin1String QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QJsonValue usernameVal;
  QJsonValue senderVal;
  QArrayDataPointer<char16_t> local_68;
  QJsonValue typeVal;
  QArrayDataPointer<char16_t> local_38;
  
  QVar4.m_data = (char *)docObj;
  QVar4.m_size = (qsizetype)&typeVal;
  QJsonObject::value(QVar4);
  bVar1 = QJsonValue::isNull(&typeVal);
  if (bVar1) goto LAB_001090ce;
  bVar1 = QJsonValue::isString(&typeVal);
  if (!bVar1) goto LAB_001090ce;
  QJsonValue::toString();
  QVar5.m_data = (char *)0x5;
  QVar5.m_size = (qsizetype)&usernameVal;
  iVar3 = QString::compare(QVar5,0x10abb3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&usernameVal);
  if (iVar3 == 0) {
    if (this->m_loggedIn != false) goto LAB_001090ce;
    QVar10.m_data = (char *)docObj;
    QVar10.m_size = (qsizetype)&usernameVal;
    QJsonObject::value(QVar10);
    bVar1 = QJsonValue::isNull(&usernameVal);
    if (!bVar1) {
      bVar1 = QJsonValue::isBool(&usernameVal);
      if (bVar1) {
        cVar2 = QJsonValue::toBool(SUB81(&usernameVal,0));
        if (cVar2 == '\0') {
          QVar14.m_data = (char *)docObj;
          QVar14.m_size = (qsizetype)&senderVal;
          QJsonObject::value(QVar14);
          QJsonValue::toString();
          loginError(this,(QString *)&local_68);
LAB_001090b2:
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
          goto LAB_001090bc;
        }
        loggedIn(this);
      }
    }
  }
  else {
    QJsonValue::toString();
    QVar6.m_data = (char *)0x7;
    QVar6.m_size = (qsizetype)&usernameVal;
    iVar3 = QString::compare(QVar6,0x10abc8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&usernameVal);
    if (iVar3 == 0) {
      QVar11.m_data = (char *)docObj;
      QVar11.m_size = (qsizetype)&usernameVal;
      QJsonObject::value(QVar11);
      QVar12.m_data = (char *)docObj;
      QVar12.m_size = (qsizetype)&senderVal;
      QJsonObject::value(QVar12);
      bVar1 = QJsonValue::isNull(&usernameVal);
      if (!bVar1) {
        bVar1 = QJsonValue::isString(&usernameVal);
        if (bVar1) {
          bVar1 = QJsonValue::isNull(&senderVal);
          if (!bVar1) {
            bVar1 = QJsonValue::isString(&senderVal);
            if (bVar1) {
              QJsonValue::toString();
              QJsonValue::toString();
              messageReceived(this,(QString *)&local_68,(QString *)&local_38);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
              goto LAB_001090b2;
            }
          }
        }
      }
LAB_001090bc:
      QJsonValue::~QJsonValue(&senderVal);
    }
    else {
      QJsonValue::toString();
      QVar7.m_data = (char *)0x7;
      QVar7.m_size = (qsizetype)&usernameVal;
      iVar3 = QString::compare(QVar7,0x10abdc);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&usernameVal);
      if (iVar3 == 0) {
        QVar13.m_data = (char *)docObj;
        QVar13.m_size = (qsizetype)&usernameVal;
        QJsonObject::value(QVar13);
        bVar1 = QJsonValue::isNull(&usernameVal);
        if (!bVar1) {
          bVar1 = QJsonValue::isString(&usernameVal);
          if (bVar1) {
            QJsonValue::toString();
            userJoined(this,(QString *)&senderVal);
LAB_00109073:
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&senderVal);
          }
        }
      }
      else {
        QJsonValue::toString();
        QVar8.m_data = (char *)0x10;
        QVar8.m_size = (qsizetype)&usernameVal;
        iVar3 = QString::compare(QVar8,0x10abed);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&usernameVal)
        ;
        if (iVar3 != 0) goto LAB_001090ce;
        QVar9.m_data = (char *)docObj;
        QVar9.m_size = (qsizetype)&usernameVal;
        QJsonObject::value(QVar9);
        bVar1 = QJsonValue::isNull(&usernameVal);
        if (!bVar1) {
          bVar1 = QJsonValue::isString(&usernameVal);
          if (bVar1) {
            QJsonValue::toString();
            userLeft(this,(QString *)&senderVal);
            goto LAB_00109073;
          }
        }
      }
    }
  }
  QJsonValue::~QJsonValue(&usernameVal);
LAB_001090ce:
  QJsonValue::~QJsonValue(&typeVal);
  return;
}

Assistant:

void ChatClient::jsonReceived(const QJsonObject &docObj)
{
    // actions depend on the type of message
    const QJsonValue typeVal = docObj.value(QLatin1String("type"));
    if (typeVal.isNull() || !typeVal.isString())
        return; // a message with no type was received so we just ignore it
    if (typeVal.toString().compare(QLatin1String("login"), Qt::CaseInsensitive) == 0) { //It's a login message
        if (m_loggedIn)
            return; // if we are already logged in we ignore
        // the success field will contain the result of our attempt to login
        const QJsonValue resultVal = docObj.value(QLatin1String("success"));
        if (resultVal.isNull() || !resultVal.isBool())
            return; // the message had no success field so we ignore
        const bool loginSuccess = resultVal.toBool();
        if (loginSuccess) {
            // we logged in succesfully and we notify it via the loggedIn signal
            emit loggedIn();
            return;
        }
        // the login attempt failed, we extract the reason of the failure from the JSON
        // and notify it via the loginError signal
        const QJsonValue reasonVal = docObj.value(QLatin1String("reason"));
        emit loginError(reasonVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("message"), Qt::CaseInsensitive) == 0) { //It's a chat message
        // we extract the text field containing the chat text
        const QJsonValue textVal = docObj.value(QLatin1String("text"));
        // we extract the sender field containing the username of the sender
        const QJsonValue senderVal = docObj.value(QLatin1String("sender"));
        if (textVal.isNull() || !textVal.isString())
            return; // the text field was invalid so we ignore
        if (senderVal.isNull() || !senderVal.isString())
            return; // the sender field was invalid so we ignore
        // we notify a new message was received via the messageReceived signal
        emit messageReceived(senderVal.toString(), textVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("newuser"), Qt::CaseInsensitive) == 0) { // A user joined the chat
        // we extract the username of the new user
        const QJsonValue usernameVal = docObj.value(QLatin1String("username"));
        if (usernameVal.isNull() || !usernameVal.isString())
            return; // the username was invalid so we ignore
        // we notify of the new user via the userJoined signal
        emit userJoined(usernameVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("userdisconnected"), Qt::CaseInsensitive) == 0) { // A user left the chat
         // we extract the username of the new user
        const QJsonValue usernameVal = docObj.value(QLatin1String("username"));
        if (usernameVal.isNull() || !usernameVal.isString())
            return; // the username was invalid so we ignore
        // we notify of the user disconnection the userLeft signal
        emit userLeft(usernameVal.toString());
    }
}